

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_args(LexState *ls,ExpDesc *e)

{
  int line_00;
  uint32_t uVar1;
  BCPos BVar2;
  BCLine line;
  BCReg base;
  BCIns ins;
  ExpDesc args;
  FuncState *fs;
  ExpDesc *e_local;
  LexState *ls_local;
  
  args._16_8_ = ls->fs;
  line_00 = ls->linenumber;
  if (ls->tok == 0x28) {
    if (line_00 != ls->lastline) {
      err_syntax(ls,LJ_ERR_XAMBIG);
    }
    lj_lex_next(ls);
    if (ls->tok == 0x29) {
      args.u.s.info = 0xe;
    }
    else {
      expr_list(ls,(ExpDesc *)&base);
      if (args.u.s.info == 0xd) {
        *(undefined1 *)(*(long *)(args._16_8_ + 0x48) + 3 + ((ulong)_base & 0xffffffff) * 8) = 0;
      }
    }
    lex_match(ls,0x29,0x28,line_00);
  }
  else if (ls->tok == 0x7b) {
    expr_table(ls,(ExpDesc *)&base);
  }
  else {
    if (ls->tok != 0x120) {
      err_syntax(ls,LJ_ERR_XFUNARG);
    }
    args.u.s.info = 3;
    args.u.s.aux = 0xffffffff;
    args.k = ~VKNIL;
    _base = (GCstr *)((ls->tokval).u64 & 0x7fffffffffff);
    lj_lex_next(ls);
  }
  uVar1 = (e->u).s.info;
  if (args.u.s.info == 0xd) {
    line = uVar1 << 8 | 0x2000041 | ((ins - uVar1) + -2) * 0x10000;
  }
  else {
    if (args.u.s.info != 0xe) {
      expr_tonextreg((FuncState *)args._16_8_,(ExpDesc *)&base);
    }
    line = uVar1 << 8 | 0x2000042 | ((*(int *)(args._16_8_ + 0x34) - uVar1) + -1) * 0x10000;
  }
  BVar2 = bcemit_INS((FuncState *)args._16_8_,line);
  e->k = VCALL;
  (e->u).s.info = BVar2;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  (e->u).s.aux = uVar1;
  *(int *)(*(long *)(args._16_8_ + 0x48) + 4 + (ulong)(*(int *)(args._16_8_ + 0x28) - 1) * 8) =
       line_00;
  *(uint32_t *)(args._16_8_ + 0x34) = uVar1 + 1;
  return;
}

Assistant:

static void parse_args(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  ExpDesc args;
  BCIns ins;
  BCReg base;
  BCLine line = ls->linenumber;
  if (ls->tok == '(') {
#if !LJ_52
    if (line != ls->lastline)
      err_syntax(ls, LJ_ERR_XAMBIG);
#endif
    lj_lex_next(ls);
    if (ls->tok == ')') {  /* f(). */
      args.k = VVOID;
    } else {
      expr_list(ls, &args);
      if (args.k == VCALL)  /* f(a, b, g()) or f(a, b, ...). */
	setbc_b(bcptr(fs, &args), 0);  /* Pass on multiple results. */
    }
    lex_match(ls, ')', '(', line);
  } else if (ls->tok == '{') {
    expr_table(ls, &args);
  } else if (ls->tok == TK_string) {
    expr_init(&args, VKSTR, 0);
    args.u.sval = strV(&ls->tokval);
    lj_lex_next(ls);
  } else {
    err_syntax(ls, LJ_ERR_XFUNARG);
    return;  /* Silence compiler. */
  }
  lj_assertFS(e->k == VNONRELOC, "bad expr type %d", e->k);
  base = e->u.s.info;  /* Base register for call. */
  if (args.k == VCALL) {
    ins = BCINS_ABC(BC_CALLM, base, 2, args.u.s.aux - base - 1 - LJ_FR2);
  } else {
    if (args.k != VVOID)
      expr_tonextreg(fs, &args);
    ins = BCINS_ABC(BC_CALL, base, 2, fs->freereg - base - LJ_FR2);
  }
  expr_init(e, VCALL, bcemit_INS(fs, ins));
  e->u.s.aux = base;
  fs->bcbase[fs->pc - 1].line = line;
  fs->freereg = base+1;  /* Leave one result by default. */
}